

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::PDU::Aggregate_State_PDU::operator==(Aggregate_State_PDU *this,Aggregate_State_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (((((((!KVar1) &&
          (KVar1 = DATA_TYPE::AggregateIdentifier::operator!=
                             (&this->m_AggregateID,&Value->m_AggregateID), !KVar1)) &&
         (this->m_ui8ForceID == Value->m_ui8ForceID)) &&
        ((this->m_ui8AggState == Value->m_ui8AggState &&
         (KVar1 = DATA_TYPE::AggregateType::operator!=
                            (&this->m_AggregateType,&Value->m_AggregateType), !KVar1)))) &&
       ((this->m_ui32Formation == Value->m_ui32Formation &&
        ((KVar1 = DATA_TYPE::AggregateMarking::operator!=
                            (&this->m_AggregateMarking,&Value->m_AggregateMarking), !KVar1 &&
         (KVar1 = DATA_TYPE::Vector::operator!=(&this->m_Dimensions,&Value->m_Dimensions), !KVar1)))
        ))) && (KVar1 = DATA_TYPE::EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori), !KVar1)) &&
     (((((KVar1 = DATA_TYPE::WorldCoordinates::operator!=
                            (&this->m_CtrOfMassLoc,&Value->m_CtrOfMassLoc), !KVar1 &&
         (KVar1 = DATA_TYPE::Vector::operator!=(&this->m_Vel,&Value->m_Vel), !KVar1)) &&
        (this->m_ui16NumAggregates == Value->m_ui16NumAggregates)) &&
       (((this->m_ui16NumEntities == Value->m_ui16NumEntities &&
         (this->m_ui16NumSilentAggregateTypes == Value->m_ui16NumSilentAggregateTypes)) &&
        ((this->m_ui16NumSilentEntityTypes == Value->m_ui16NumSilentEntityTypes &&
         ((bVar2 = std::operator!=(&this->m_vAI,&Value->m_vAI), !bVar2 &&
          (bVar2 = std::operator!=(&this->m_vEI,&Value->m_vEI), !bVar2)))))))) &&
      ((bVar2 = std::operator!=(&this->m_vSASL,&Value->m_vSASL), !bVar2 &&
       (bVar2 = std::operator!=(&this->m_vSESL,&Value->m_vSESL), !bVar2)))))) {
    bVar2 = std::operator!=(&this->m_vVD,&Value->m_vVD);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Aggregate_State_PDU::operator == ( const Aggregate_State_PDU & Value ) const
{
    if( Header::operator                !=( Value ) )                            return false;
    if( m_AggregateID                   != Value.m_AggregateID )                 return false;
    if( m_ui8ForceID                    != Value.m_ui8ForceID )                  return false;
    if( m_ui8AggState                   != Value.m_ui8AggState )                 return false;
    if( m_AggregateType                 != Value.m_AggregateType )               return false;
    if( m_ui32Formation                 != Value.m_ui32Formation )               return false;
    if( m_AggregateMarking              != Value.m_AggregateMarking )            return false;
    if( m_Dimensions                    != Value.m_Dimensions )                  return false;
    if( m_Ori                           != Value.m_Ori )                         return false;
    if( m_CtrOfMassLoc                  != Value.m_CtrOfMassLoc )                return false;
    if( m_Vel                           != Value.m_Vel )                         return false;
    if( m_ui16NumAggregates             != Value.m_ui16NumAggregates )           return false;
    if( m_ui16NumEntities               != Value.m_ui16NumEntities )             return false;
    if( m_ui16NumSilentAggregateTypes   != Value.m_ui16NumSilentAggregateTypes ) return false;
    if( m_ui16NumSilentEntityTypes      != Value.m_ui16NumSilentEntityTypes )    return false;
    if( m_vAI                           != Value.m_vAI )                         return false;
    if( m_vEI                           != Value.m_vEI )                         return false;
    if( m_vSASL                         != Value.m_vSASL )                       return false;
    if( m_vSESL                         != Value.m_vSESL )                       return false;
    if( m_vVD                           != Value.m_vVD )                         return false;
    return true;
}